

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  bool bVar5;
  int iVar6;
  
  iVar6 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar5 = 0 < iVar6;
  if (0 < iVar6) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(message_type->nested_type_).super_RepeatedPtrFieldBase,0);
    bVar2 = AddNestedExtensions(this,filename,pTVar3,value);
    if (bVar2) {
      iVar6 = 1;
      do {
        iVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar5 = iVar6 < iVar1;
        if (iVar1 <= iVar6) goto LAB_0038e10d;
        pTVar3 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar6);
        bVar2 = AddNestedExtensions(this,filename,pTVar3,value);
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
    if (bVar5) {
      return false;
    }
  }
LAB_0038e10d:
  iVar6 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
  bVar5 = iVar6 < 1;
  if (0 < iVar6) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(message_type->extension_).super_RepeatedPtrFieldBase,0);
    bVar2 = AddExtension(this,filename,pTVar4,value);
    if (bVar2) {
      iVar6 = 1;
      do {
        iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar5 = iVar1 <= iVar6;
        if (iVar1 <= iVar6) {
          return bVar5;
        }
        pTVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar6);
        bVar2 = AddExtension(this,filename,pTVar4,value);
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
  }
  return bVar5;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}